

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_draw_command * nk_draw_list_command_last(nk_draw_list *list)

{
  nk_buffer *pnVar1;
  
  if (list->cmd_count == 0) {
    __assert_fail("list->cmd_count",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                  ,0x24a1,"struct nk_draw_command *nk_draw_list_command_last(struct nk_draw_list *)"
                 );
  }
  pnVar1 = list->buffer;
  if (pnVar1 != (nk_buffer *)0x0) {
    return (nk_draw_command *)
           ((long)(pnVar1->memory).ptr +
           (ulong)(list->cmd_count - 1) * -0x20 + ((pnVar1->memory).size - list->cmd_offset));
  }
  __assert_fail("buffer",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wjakob[P]glfw/deps/nuklear.h"
                ,0x2041,"void *nk_buffer_memory(struct nk_buffer *)");
}

Assistant:

NK_INTERN struct nk_draw_command*
nk_draw_list_command_last(struct nk_draw_list *list)
{
    void *memory;
    nk_size size;
    struct nk_draw_command *cmd;
    NK_ASSERT(list->cmd_count);

    memory = nk_buffer_memory(list->buffer);
    size = nk_buffer_total(list->buffer);
    cmd = nk_ptr_add(struct nk_draw_command, memory, size - list->cmd_offset);
    return (cmd - (list->cmd_count-1));
}